

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu540c.c
# Opt level: O2

MPP_RET hal_h264e_vepu540c_get_task(void *hal,HalEncTask *task)

{
  long lVar1;
  EncRcTask *pEVar2;
  RK_S32 RVar3;
  MppMeta meta;
  undefined8 *puVar4;
  uint uVar5;
  RK_U32 RVar6;
  bool bVar7;
  
  lVar1 = *hal;
  RVar6 = (task->syntax).number;
  if ((int)RVar6 < 1) {
    RVar6 = 0;
  }
  puVar4 = (undefined8 *)((long)(task->syntax).data + 8);
  uVar5 = 0;
  while (bVar7 = RVar6 != 0, RVar6 = RVar6 - 1, bVar7) {
    switch(*(undefined4 *)(puVar4 + -1)) {
    case 0:
      if (((byte)hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu540c","update cfg","update_vepu540c_syntax");
      }
      *(undefined8 *)hal = *puVar4;
      break;
    case 1:
      if (((byte)hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu540c","update sps","update_vepu540c_syntax");
      }
      *(undefined8 *)((long)hal + 0x38) = *puVar4;
      break;
    case 2:
      if (((byte)hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu540c","update pps","update_vepu540c_syntax");
      }
      *(undefined8 *)((long)hal + 0x40) = *puVar4;
      break;
    case 3:
      if (((byte)hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu540c","update dpb","update_vepu540c_syntax");
      }
      break;
    case 4:
      if (((byte)hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu540c","update slice","update_vepu540c_syntax");
      }
      *(undefined8 *)((long)hal + 0x48) = *puVar4;
      break;
    case 5:
      if (((byte)hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu540c","update frames","update_vepu540c_syntax");
      }
      *(undefined8 *)((long)hal + 0x50) = *puVar4;
      break;
    case 6:
      if (((byte)hal_h264e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h264e_vepu540c","update prefix nal","update_vepu540c_syntax");
      }
      *(undefined8 *)((long)hal + 0x68) = *puVar4;
      break;
    default:
      _mpp_log_l(4,"hal_h264e_vepu540c","invalid syntax type %d\n","update_vepu540c_syntax");
    }
    uVar5 = uVar5 | 1 << (*(byte *)(puVar4 + -1) & 0x1f);
    puVar4 = puVar4 + 2;
  }
  pEVar2 = task->rc_task;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","enter %p\n","hal_h264e_vepu540c_get_task",hal);
  }
  if ((uVar5 & 1) != 0) {
    setup_hal_bufs((HalH264eVepu540cCtx *)hal);
  }
  if ((((pEVar2->frm).val & 0x400000000) == 0) &&
     (RVar3 = mpp_frame_has_meta(task->frame), RVar3 != 0)) {
    meta = mpp_frame_get_meta(task->frame);
    mpp_meta_get_ptr(meta,KEY_ROI_DATA,(void **)((long)hal + 0x158));
  }
  *(undefined4 *)(lVar1 + 0x364) = *(undefined4 *)(*(long *)((long)hal + 0x38) + 0x28);
  h264e_vepu_stream_amend_config
            ((HalH264eVepuStreamAmend *)((long)hal + 0x70),task->packet,*hal,
             *(H264eSlice **)((long)hal + 0x48),*(H264ePrefixNal **)((long)hal + 0x68));
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","leave %p\n","hal_h264e_vepu540c_get_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu540c_get_task(void *hal, HalEncTask *task)
{
    HalH264eVepu540cCtx *ctx = (HalH264eVepu540cCtx *)hal;
    MppEncH264HwCfg *hw_cfg = &ctx->cfg->codec.h264.hw_cfg;
    RK_U32 updated = update_vepu540c_syntax(ctx, &task->syntax);
    EncFrmStatus *frm_status = &task->rc_task->frm;
    hal_h264e_dbg_func("enter %p\n", hal);

    if (updated & SYN_TYPE_FLAG(H264E_SYN_CFG))
        setup_hal_bufs(ctx);


    if (!frm_status->reencode && mpp_frame_has_meta(task->frame)) {
        MppMeta meta = mpp_frame_get_meta(task->frame);

        mpp_meta_get_ptr(meta, KEY_ROI_DATA, (void **)&ctx->roi_data);
    }

    /* if not VEPU1/2, update log2_max_frame_num_minus4 in hw_cfg */
    hw_cfg->hw_log2_max_frame_num_minus4 = ctx->sps->log2_max_frame_num_minus4;

    h264e_vepu_stream_amend_config(&ctx->amend, task->packet, ctx->cfg,
                                   ctx->slice, ctx->prefix);

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}